

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_asm.c
# Opt level: O2

void emit_asm_bytes(BuildCtx *ctx,uint8_t *p,int n)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  if (0 < n) {
    uVar1 = (ulong)(uint)n;
  }
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    if ((uVar2 & 0xf) == 0) {
      fprintf((FILE *)ctx->fp,"\t.byte %d",(ulong)p[uVar2]);
    }
    else {
      fprintf((FILE *)ctx->fp,",%d",(ulong)p[uVar2]);
      if (((uint)uVar2 & 0xf) == 0xf) {
        putc(10,(FILE *)ctx->fp);
      }
    }
  }
  if ((n & 0xfU) != 0) {
    putc(10,(FILE *)ctx->fp);
    return;
  }
  return;
}

Assistant:

static void emit_asm_bytes(BuildCtx *ctx, uint8_t *p, int n)
{
  int i;
  for (i = 0; i < n; i++) {
    if ((i & 15) == 0)
      fprintf(ctx->fp, "\t.byte %d", p[i]);
    else
      fprintf(ctx->fp, ",%d", p[i]);
    if ((i & 15) == 15) putc('\n', ctx->fp);
  }
  if ((n & 15) != 0) putc('\n', ctx->fp);
}